

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Abstractions.hpp
# Opt level: O0

bool __thiscall
Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>_>::Path::nextStep
          (Path *this,uint baseDepth)

{
  bool bVar1;
  size_t sVar2;
  uint in_ESI;
  Path *in_RDI;
  Path *in_stack_00000020;
  uint in_stack_000000ac;
  Path *in_stack_000000b0;
  byte local_21;
  bool local_1;
  
  bVar1 = Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
          top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1)_1_>
                    ();
  if (bVar1) {
    push(in_stack_000000b0,in_stack_000000ac);
    local_1 = true;
  }
  else {
    Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
    top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1&)_1_>
              (in_RDI);
    while( true ) {
      sVar2 = depth(in_RDI);
      local_21 = 0;
      if (1 < sVar2) {
        sVar2 = depth(in_RDI);
        local_21 = 0;
        if (in_ESI <= sVar2) {
          bVar1 = Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
                  top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1)_2_>
                            (in_RDI);
          local_21 = bVar1 ^ 0xff;
        }
      }
      if ((local_21 & 1) == 0) break;
      pop(in_stack_00000020);
      Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::
      top<Inferences::ALASCA::Abstraction<Kernel::NumTraits<Kernel::RationalConstantType>>::Path::nextStep(unsigned_int)::_lambda(auto:1&)_2_>
                (in_RDI);
    }
    sVar2 = depth(in_RDI);
    if ((in_ESI <= sVar2) && (sVar2 = depth(in_RDI), sVar2 != 1)) {
      return true;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool nextStep(unsigned baseDepth) {
      if (top([](auto t){ return t.canPush(); })) {
        push(0);
        return true;
      } else {
        top([](auto& x) { x.idx++; });
        while(depth() > 1 && depth() >= baseDepth && !top([&](auto t) { return t.inBounds(); })) {
          pop();
          top([](auto& x) { x.idx++; });
        }
        if (depth() < baseDepth || depth() == 1) {
          return false;
        } else {
          return true;
        }
      }
    }